

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_cgraph * ggml_new_graph_custom(ggml_context *ctx,size_t size,_Bool grads)

{
  ggml_tensor **ppgVar1;
  ggml_tensor **ppgVar2;
  ggml_tensor **__s;
  size_t sVar3;
  ggml_object *pgVar4;
  ggml_tensor **ppgVar5;
  void *ptr;
  ggml_cgraph *pgVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ggml_tensor **ppgVar10;
  ggml_tensor **ppgVar11;
  
  sVar3 = ggml_graph_nbytes(size,grads);
  pgVar4 = ggml_new_object(ctx,GGML_OBJECT_TYPE_GRAPH,sVar3);
  uVar9 = 0;
  uVar7 = 0x20;
  do {
    uVar8 = uVar7 + uVar9 >> 1;
    if (ggml_hash_size::primes[uVar8] < size * 2) {
      uVar9 = uVar8 + 1;
      uVar8 = uVar7;
    }
    uVar7 = uVar8;
  } while (uVar9 < uVar8);
  pgVar6 = (ggml_cgraph *)((long)ctx->mem_buffer + pgVar4->offs);
  if (uVar9 < 0x20) {
    sVar3 = ggml_hash_size::primes[uVar9];
  }
  else {
    sVar3 = size * 2 | 1;
  }
  ppgVar5 = (ggml_tensor **)((ulong)((long)&pgVar6[1].n_nodes + 3U) & 0xfffffffffffffff8);
  ppgVar1 = ppgVar5 + size;
  ppgVar2 = ppgVar1 + size + sVar3;
  ppgVar10 = ppgVar2 + sVar3;
  if (!grads) {
    ppgVar10 = ppgVar2;
  }
  ppgVar11 = (ggml_tensor **)0x0;
  if (grads) {
    ppgVar11 = ppgVar2;
  }
  __s = ppgVar10 + sVar3;
  if (!grads) {
    ppgVar10 = (ggml_tensor **)0x0;
    __s = ppgVar2;
  }
  pgVar6->size = (int)size;
  pgVar6->n_nodes = 0;
  pgVar6->n_leafs = 0;
  pgVar6->nodes = ppgVar5;
  pgVar6->grads = ppgVar11;
  pgVar6->grad_accs = ppgVar10;
  pgVar6->leafs = ppgVar1;
  (pgVar6->visited_hash_set).size = sVar3;
  (pgVar6->visited_hash_set).used = (ggml_bitset_t *)__s;
  (pgVar6->visited_hash_set).keys = ppgVar1 + size;
  pgVar6->order = GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT;
  memset(__s,0,sVar3 + 0x1f >> 3 & 0xfffffffffffffffc);
  if (grads) {
    memset(pgVar6->grads,0,sVar3 << 3);
    memset(pgVar6->grad_accs,0,sVar3 << 3);
  }
  return pgVar6;
}

Assistant:

struct ggml_cgraph * ggml_new_graph_custom(struct ggml_context * ctx, size_t size, bool grads) {
    const size_t obj_size = ggml_graph_nbytes(size, grads);
    struct ggml_object * obj = ggml_new_object(ctx, GGML_OBJECT_TYPE_GRAPH, obj_size);
    struct ggml_cgraph * cgraph = (struct ggml_cgraph *) ((char *) ctx->mem_buffer + obj->offs);

    // the size of the hash table is doubled since it needs to hold both nodes and leafs
    size_t hash_size = ggml_hash_size(size * 2);

    void * p = cgraph + 1;

    struct ggml_tensor ** nodes_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** leafs_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** hash_keys_ptr =         incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** grads_ptr     = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;
    struct ggml_tensor ** grad_accs_ptr = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;

    ggml_bitset_t * hash_used = incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    // check that we allocated the correct amount of memory
    assert(obj_size == (size_t)((char *)p - (char *)cgraph));

    *cgraph = (struct ggml_cgraph) {
        /*.size         =*/ size,
        /*.n_nodes      =*/ 0,
        /*.n_leafs      =*/ 0,
        /*.nodes        =*/ nodes_ptr,
        /*.grads        =*/ grads_ptr,
        /*.grad_accs    =*/ grad_accs_ptr,
        /*.leafs        =*/ leafs_ptr,
        /*.hash_table   =*/ { hash_size, hash_used, hash_keys_ptr },
        /*.order        =*/ GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT,
    };

    ggml_hash_set_reset(&cgraph->visited_hash_set);
    if (grads) {
        memset(cgraph->grads,     0, hash_size*sizeof(struct ggml_tensor *));
        memset(cgraph->grad_accs, 0, hash_size*sizeof(struct ggml_tensor *));
    }

    return cgraph;
}